

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer.cc
# Opt level: O3

void __thiscall google::protobuf::io::Tokenizer::~Tokenizer(Tokenizer *this)

{
  pointer pcVar1;
  
  if (this->buffer_pos_ < this->buffer_size_) {
    (*this->input_->_vptr_ZeroCopyInputStream[3])();
  }
  pcVar1 = (this->previous_).text._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->previous_).text.field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->current_).text._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->current_).text.field_2) {
    operator_delete(pcVar1);
    return;
  }
  return;
}

Assistant:

Tokenizer::~Tokenizer() {
  // If we had any buffer left unread, return it to the underlying stream
  // so that someone else can read it.
  if (buffer_size_ > buffer_pos_) {
    input_->BackUp(buffer_size_ - buffer_pos_);
  }
}